

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

void upb_Message_SetBaseFieldInt32(upb_Message *msg,upb_MiniTableField *f,int32_t value)

{
  upb_CType uVar1;
  undefined1 local_14 [4];
  
  uVar1 = upb_MiniTableField_CType(f);
  if (uVar1 != kUpb_CType_Int32) {
    uVar1 = upb_MiniTableField_CType(f);
    if (uVar1 != kUpb_CType_Enum) {
      __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int32 || upb_MiniTableField_CType(f) == kUpb_CType_Enum"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x273,
                    "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
                   );
    }
  }
  if ((f->mode_dont_copy_me__upb_internal_use_only & 3) == 2) {
    if ((f->mode_dont_copy_me__upb_internal_use_only & 0xc0) == 0x40) {
      upb_Message_SetBaseField(msg,f,local_14);
      return;
    }
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_4Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x275,
                  "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  __assert_fail("upb_MiniTableField_IsScalar(f)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x274,
                "void upb_Message_SetBaseFieldInt32(struct upb_Message *, const upb_MiniTableField *, int32_t)"
               );
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseFieldInt32(struct upb_Message* msg,
                                                  const upb_MiniTableField* f,
                                                  int32_t value) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int32 ||
             upb_MiniTableField_CType(f) == kUpb_CType_Enum);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_4Byte);
  upb_Message_SetBaseField(msg, f, &value);
}